

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O1

void __thiscall
duckdb::PositionalJoinGlobalState::~PositionalJoinGlobalState(PositionalJoinGlobalState *this)

{
  pointer puVar1;
  
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__PositionalJoinGlobalState_024a6ff8;
  DataChunk::~DataChunk(&this->source);
  puVar1 = (this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->scan_state);
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::~vector
            (&(this->append_state).vector_data.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
            );
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->append_state);
  ColumnDataCollection::~ColumnDataCollection(&this->rhs);
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

explicit PositionalJoinGlobalState(ClientContext &context, const PhysicalPositionalJoin &op)
	    : rhs(context, op.children[1].get().GetTypes()), initialized(false), source_offset(0), exhausted(false) {
		rhs.InitializeAppend(append_state);
	}